

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O3

void __thiscall QWindowContainerPrivate::markParentChain(QWindowContainerPrivate *this)

{
  undefined1 *puVar1;
  QWidgetPrivate *this_00;
  long lVar2;
  
  for (lVar2 = *(long *)&(this->super_QWidgetPrivate).field_0x8; lVar2 != 0;
      lVar2 = *(long *)(*(long *)(lVar2 + 8) + 0x10)) {
    this_00 = *(QWidgetPrivate **)(lVar2 + 8);
    QWidgetPrivate::createExtra(this_00);
    puVar1 = &((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x100;
  }
  return;
}

Assistant:

void markParentChain() {
        Q_Q(QWindowContainer);
        QWidget *p = q;
        while (p) {
            QWidgetPrivate *d = static_cast<QWidgetPrivate *>(QWidgetPrivate::get(p));
            d->createExtra();
            d->extra->hasWindowContainer = true;
            p = p->parentWidget();
        }
    }